

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  long lVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined4 uVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined4 uVar92;
  ulong uVar93;
  long lVar94;
  ulong uVar95;
  uint uVar96;
  ulong uVar97;
  Scene *pSVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  float fVar116;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar118 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  float fVar136;
  undefined1 auVar137 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [64];
  undefined1 auVar145 [32];
  uint uVar147;
  uint uVar148;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  uint uVar153;
  undefined1 auVar146 [64];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_1644;
  RTCIntersectArguments *local_1640;
  Geometry *local_1638;
  long local_1630;
  long local_1628;
  ulong local_1620;
  ulong local_1618;
  ulong *local_1610;
  RayQueryContext *local_1608;
  undefined1 local_1600 [32];
  float local_15e0;
  float local_15dc;
  float local_15d8;
  float local_15d4;
  undefined4 local_15d0;
  undefined4 local_15cc;
  uint local_15c8;
  uint local_15c4;
  uint local_15c0;
  RTCFilterFunctionNArguments local_15b0;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [8];
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar116 = ray->tfar;
    if (0.0 <= fVar116) {
      local_1610 = local_11f8;
      aVar2 = (ray->dir).field_0;
      auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar117._8_4_ = 0x7fffffff;
      auVar117._0_8_ = 0x7fffffff7fffffff;
      auVar117._12_4_ = 0x7fffffff;
      auVar117 = vandps_avx((undefined1  [16])aVar2,auVar117);
      auVar127._8_4_ = 0x219392ef;
      auVar127._0_8_ = 0x219392ef219392ef;
      auVar127._12_4_ = 0x219392ef;
      auVar117 = vcmpps_avx(auVar117,auVar127,1);
      auVar117 = vblendvps_avx((undefined1  [16])aVar2,auVar127,auVar117);
      auVar127 = vrcpps_avx(auVar117);
      fVar120 = auVar127._0_4_;
      auVar112._0_4_ = fVar120 * auVar117._0_4_;
      fVar121 = auVar127._4_4_;
      auVar112._4_4_ = fVar121 * auVar117._4_4_;
      fVar122 = auVar127._8_4_;
      auVar112._8_4_ = fVar122 * auVar117._8_4_;
      fVar124 = auVar127._12_4_;
      auVar112._12_4_ = fVar124 * auVar117._12_4_;
      auVar128._8_4_ = 0x3f800000;
      auVar128._0_8_ = 0x3f8000003f800000;
      auVar128._12_4_ = 0x3f800000;
      auVar117 = vsubps_avx(auVar128,auVar112);
      uVar92 = *(undefined4 *)&(ray->org).field_0;
      local_13e0._4_4_ = uVar92;
      local_13e0._0_4_ = uVar92;
      local_13e0._8_4_ = uVar92;
      local_13e0._12_4_ = uVar92;
      local_13e0._16_4_ = uVar92;
      local_13e0._20_4_ = uVar92;
      local_13e0._24_4_ = uVar92;
      local_13e0._28_4_ = uVar92;
      auVar133 = ZEXT3264(local_13e0);
      uVar92 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1400._4_4_ = uVar92;
      local_1400._0_4_ = uVar92;
      local_1400._8_4_ = uVar92;
      local_1400._12_4_ = uVar92;
      local_1400._16_4_ = uVar92;
      local_1400._20_4_ = uVar92;
      local_1400._24_4_ = uVar92;
      local_1400._28_4_ = uVar92;
      auVar135 = ZEXT3264(local_1400);
      uVar92 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1420._4_4_ = uVar92;
      local_1420._0_4_ = uVar92;
      local_1420._8_4_ = uVar92;
      local_1420._12_4_ = uVar92;
      local_1420._16_4_ = uVar92;
      local_1420._20_4_ = uVar92;
      local_1420._24_4_ = uVar92;
      local_1420._28_4_ = uVar92;
      auVar138 = ZEXT3264(local_1420);
      auVar113._0_4_ = fVar120 + fVar120 * auVar117._0_4_;
      auVar113._4_4_ = fVar121 + fVar121 * auVar117._4_4_;
      auVar113._8_4_ = fVar122 + fVar122 * auVar117._8_4_;
      auVar113._12_4_ = fVar124 + fVar124 * auVar117._12_4_;
      auVar117 = vshufps_avx(auVar113,auVar113,0);
      local_1440._16_16_ = auVar117;
      local_1440._0_16_ = auVar117;
      auVar146 = ZEXT3264(local_1440);
      auVar117 = vmovshdup_avx(auVar113);
      auVar127 = vshufps_avx(auVar113,auVar113,0x55);
      local_1460._16_16_ = auVar127;
      local_1460._0_16_ = auVar127;
      auVar155 = ZEXT3264(local_1460);
      auVar127 = vshufpd_avx(auVar113,auVar113,1);
      auVar112 = vshufps_avx(auVar113,auVar113,0xaa);
      local_1618 = (ulong)(auVar113._0_4_ < 0.0) << 5;
      local_1480._16_16_ = auVar112;
      local_1480._0_16_ = auVar112;
      auVar115 = ZEXT3264(local_1480);
      local_1620 = (ulong)(auVar117._0_4_ < 0.0) << 5 | 0x40;
      uVar100 = (ulong)(auVar127._0_4_ < 0.0) << 5 | 0x80;
      uVar101 = local_1618 ^ 0x20;
      uVar102 = local_1620 ^ 0x20;
      auVar117 = vshufps_avx(auVar4,auVar4,0);
      local_14a0._16_16_ = auVar117;
      local_14a0._0_16_ = auVar117;
      auVar118 = ZEXT3264(local_14a0);
      auVar117 = vshufps_avx(ZEXT416((uint)fVar116),ZEXT416((uint)fVar116),0);
      local_1520._16_16_ = mm_lookupmask_ps._240_16_;
      local_1520._0_16_ = mm_lookupmask_ps._240_16_;
      local_14e0 = vperm2f128_avx(local_1520,mm_lookupmask_ps._0_32_,2);
      local_14c0._16_16_ = auVar117;
      local_14c0._0_16_ = auVar117;
      auVar130 = ZEXT3264(local_14c0);
      auVar103._8_4_ = 0xbf800000;
      auVar103._0_8_ = 0xbf800000bf800000;
      auVar103._12_4_ = 0xbf800000;
      auVar103._16_4_ = 0xbf800000;
      auVar103._20_4_ = 0xbf800000;
      auVar103._24_4_ = 0xbf800000;
      auVar103._28_4_ = 0xbf800000;
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar109._16_4_ = 0x3f800000;
      auVar109._20_4_ = 0x3f800000;
      auVar109._24_4_ = 0x3f800000;
      auVar109._28_4_ = 0x3f800000;
      _local_1500 = vblendvps_avx(auVar109,auVar103,local_14e0);
      local_1608 = context;
LAB_002e96ff:
      do {
        uVar99 = local_1610[-1];
        local_1610 = local_1610 + -1;
        while ((uVar99 & 8) == 0) {
          auVar103 = vsubps_avx(*(undefined1 (*) [32])(uVar99 + 0x40 + local_1618),auVar133._0_32_);
          auVar69._4_4_ = auVar146._4_4_ * auVar103._4_4_;
          auVar69._0_4_ = auVar146._0_4_ * auVar103._0_4_;
          auVar69._8_4_ = auVar146._8_4_ * auVar103._8_4_;
          auVar69._12_4_ = auVar146._12_4_ * auVar103._12_4_;
          auVar69._16_4_ = auVar146._16_4_ * auVar103._16_4_;
          auVar69._20_4_ = auVar146._20_4_ * auVar103._20_4_;
          auVar69._24_4_ = auVar146._24_4_ * auVar103._24_4_;
          auVar69._28_4_ = auVar103._28_4_;
          auVar103 = vsubps_avx(*(undefined1 (*) [32])(uVar99 + 0x40 + local_1620),auVar135._0_32_);
          auVar70._4_4_ = auVar155._4_4_ * auVar103._4_4_;
          auVar70._0_4_ = auVar155._0_4_ * auVar103._0_4_;
          auVar70._8_4_ = auVar155._8_4_ * auVar103._8_4_;
          auVar70._12_4_ = auVar155._12_4_ * auVar103._12_4_;
          auVar70._16_4_ = auVar155._16_4_ * auVar103._16_4_;
          auVar70._20_4_ = auVar155._20_4_ * auVar103._20_4_;
          auVar70._24_4_ = auVar155._24_4_ * auVar103._24_4_;
          auVar70._28_4_ = auVar103._28_4_;
          auVar103 = vmaxps_avx(auVar69,auVar70);
          auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar99 + 0x40 + uVar100),auVar138._0_32_);
          auVar71._4_4_ = auVar115._4_4_ * auVar109._4_4_;
          auVar71._0_4_ = auVar115._0_4_ * auVar109._0_4_;
          auVar71._8_4_ = auVar115._8_4_ * auVar109._8_4_;
          auVar71._12_4_ = auVar115._12_4_ * auVar109._12_4_;
          auVar71._16_4_ = auVar115._16_4_ * auVar109._16_4_;
          auVar71._20_4_ = auVar115._20_4_ * auVar109._20_4_;
          auVar71._24_4_ = auVar115._24_4_ * auVar109._24_4_;
          auVar71._28_4_ = auVar109._28_4_;
          auVar109 = vmaxps_avx(auVar71,auVar118._0_32_);
          auVar103 = vmaxps_avx(auVar103,auVar109);
          auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar99 + 0x40 + uVar101),auVar133._0_32_);
          auVar72._4_4_ = auVar146._4_4_ * auVar109._4_4_;
          auVar72._0_4_ = auVar146._0_4_ * auVar109._0_4_;
          auVar72._8_4_ = auVar146._8_4_ * auVar109._8_4_;
          auVar72._12_4_ = auVar146._12_4_ * auVar109._12_4_;
          auVar72._16_4_ = auVar146._16_4_ * auVar109._16_4_;
          auVar72._20_4_ = auVar146._20_4_ * auVar109._20_4_;
          auVar72._24_4_ = auVar146._24_4_ * auVar109._24_4_;
          auVar72._28_4_ = auVar109._28_4_;
          auVar109 = vsubps_avx(*(undefined1 (*) [32])(uVar99 + 0x40 + uVar102),auVar135._0_32_);
          auVar73._4_4_ = auVar155._4_4_ * auVar109._4_4_;
          auVar73._0_4_ = auVar155._0_4_ * auVar109._0_4_;
          auVar73._8_4_ = auVar155._8_4_ * auVar109._8_4_;
          auVar73._12_4_ = auVar155._12_4_ * auVar109._12_4_;
          auVar73._16_4_ = auVar155._16_4_ * auVar109._16_4_;
          auVar73._20_4_ = auVar155._20_4_ * auVar109._20_4_;
          auVar73._24_4_ = auVar155._24_4_ * auVar109._24_4_;
          auVar73._28_4_ = auVar109._28_4_;
          auVar109 = vminps_avx(auVar72,auVar73);
          auVar69 = vsubps_avx(*(undefined1 (*) [32])(uVar99 + 0x40 + (uVar100 ^ 0x20)),
                               auVar138._0_32_);
          auVar74._4_4_ = auVar115._4_4_ * auVar69._4_4_;
          auVar74._0_4_ = auVar115._0_4_ * auVar69._0_4_;
          auVar74._8_4_ = auVar115._8_4_ * auVar69._8_4_;
          auVar74._12_4_ = auVar115._12_4_ * auVar69._12_4_;
          auVar74._16_4_ = auVar115._16_4_ * auVar69._16_4_;
          auVar74._20_4_ = auVar115._20_4_ * auVar69._20_4_;
          auVar74._24_4_ = auVar115._24_4_ * auVar69._24_4_;
          auVar74._28_4_ = auVar69._28_4_;
          auVar69 = vminps_avx(auVar74,auVar130._0_32_);
          auVar109 = vminps_avx(auVar109,auVar69);
          auVar103 = vcmpps_avx(auVar103,auVar109,2);
          uVar96 = vmovmskps_avx(auVar103);
          if (uVar96 == 0) {
            if (local_1610 == &local_1200) {
              return;
            }
            goto LAB_002e96ff;
          }
          uVar96 = uVar96 & 0xff;
          uVar93 = uVar99 & 0xfffffffffffffff0;
          lVar3 = 0;
          if (uVar96 != 0) {
            for (; (uVar96 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          uVar99 = *(ulong *)(uVar93 + lVar3 * 8);
          uVar96 = uVar96 - 1 & uVar96;
          if (uVar96 != 0) {
            *local_1610 = uVar99;
            local_1610 = local_1610 + 1;
            lVar3 = 0;
            if (uVar96 != 0) {
              for (; (uVar96 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            uVar99 = *(ulong *)(uVar93 + lVar3 * 8);
            uVar96 = uVar96 - 1 & uVar96;
            uVar97 = (ulong)uVar96;
            if (uVar96 != 0) {
              do {
                *local_1610 = uVar99;
                local_1610 = local_1610 + 1;
                lVar3 = 0;
                if (uVar97 != 0) {
                  for (; (uVar97 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                uVar99 = *(ulong *)(uVar93 + lVar3 * 8);
                uVar97 = uVar97 & uVar97 - 1;
              } while (uVar97 != 0);
            }
          }
        }
        local_1628 = (ulong)((uint)uVar99 & 0xf) - 8;
        if (local_1628 != 0) {
          uVar99 = uVar99 & 0xfffffffffffffff0;
          local_1630 = 0;
          do {
            lVar94 = local_1630 * 0xe0;
            lVar3 = uVar99 + 0xd0 + lVar94;
            local_13c0 = *(undefined8 *)(lVar3 + 0x10);
            uStack_13b8 = *(undefined8 *)(lVar3 + 0x18);
            lVar3 = uVar99 + 0xc0 + lVar94;
            local_13a0 = *(undefined8 *)(lVar3 + 0x10);
            uStack_1398 = *(undefined8 *)(lVar3 + 0x18);
            uStack_1390 = local_13a0;
            uStack_1388 = uStack_1398;
            uStack_13b0 = local_13c0;
            uStack_13a8 = uStack_13b8;
            auVar114._16_16_ = *(undefined1 (*) [16])(uVar99 + 0x60 + lVar94);
            auVar114._0_16_ = *(undefined1 (*) [16])(uVar99 + lVar94);
            auVar129._16_16_ = *(undefined1 (*) [16])(uVar99 + 0x70 + lVar94);
            auVar129._0_16_ = *(undefined1 (*) [16])(uVar99 + 0x10 + lVar94);
            auVar134._16_16_ = *(undefined1 (*) [16])(uVar99 + 0x80 + lVar94);
            auVar134._0_16_ = *(undefined1 (*) [16])(uVar99 + 0x20 + lVar94);
            auVar117 = *(undefined1 (*) [16])(uVar99 + 0x30 + lVar94);
            auVar104._16_16_ = auVar117;
            auVar104._0_16_ = auVar117;
            auVar4 = *(undefined1 (*) [16])(uVar99 + 0x40 + lVar94);
            auVar105._16_16_ = auVar4;
            auVar105._0_16_ = auVar4;
            auVar127 = *(undefined1 (*) [16])(uVar99 + 0x50 + lVar94);
            auVar110._16_16_ = auVar127;
            auVar110._0_16_ = auVar127;
            auVar112 = *(undefined1 (*) [16])(uVar99 + 0x90 + lVar94);
            auVar145._16_16_ = auVar112;
            auVar145._0_16_ = auVar112;
            auVar112 = *(undefined1 (*) [16])(uVar99 + 0xa0 + lVar94);
            auVar154._16_16_ = auVar112;
            auVar154._0_16_ = auVar112;
            auVar112 = *(undefined1 (*) [16])(uVar99 + 0xb0 + lVar94);
            auVar156._16_16_ = auVar112;
            auVar156._0_16_ = auVar112;
            local_1580 = vsubps_avx(auVar114,auVar104);
            local_1540 = vsubps_avx(auVar129,auVar105);
            auVar103 = vsubps_avx(auVar134,auVar110);
            auVar109 = vsubps_avx(auVar145,auVar114);
            auVar69 = vsubps_avx(auVar154,auVar129);
            auVar70 = vsubps_avx(auVar156,auVar134);
            fVar122 = auVar70._0_4_;
            fVar157 = local_1540._0_4_;
            fVar9 = auVar70._4_4_;
            fVar159 = local_1540._4_4_;
            auVar75._4_4_ = fVar159 * fVar9;
            auVar75._0_4_ = fVar157 * fVar122;
            fVar19 = auVar70._8_4_;
            fVar160 = local_1540._8_4_;
            auVar75._8_4_ = fVar160 * fVar19;
            fVar29 = auVar70._12_4_;
            fVar161 = local_1540._12_4_;
            auVar75._12_4_ = fVar161 * fVar29;
            fVar39 = auVar70._16_4_;
            fVar162 = local_1540._16_4_;
            auVar75._16_4_ = fVar162 * fVar39;
            fVar49 = auVar70._20_4_;
            fVar163 = local_1540._20_4_;
            auVar75._20_4_ = fVar163 * fVar49;
            fVar59 = auVar70._24_4_;
            fVar164 = local_1540._24_4_;
            auVar75._24_4_ = fVar164 * fVar59;
            auVar75._28_4_ = auVar117._12_4_;
            fVar124 = auVar69._0_4_;
            fVar136 = auVar103._0_4_;
            fVar10 = auVar69._4_4_;
            fVar139 = auVar103._4_4_;
            auVar77._4_4_ = fVar139 * fVar10;
            auVar77._0_4_ = fVar136 * fVar124;
            fVar20 = auVar69._8_4_;
            fVar140 = auVar103._8_4_;
            auVar77._8_4_ = fVar140 * fVar20;
            fVar30 = auVar69._12_4_;
            fVar141 = auVar103._12_4_;
            auVar77._12_4_ = fVar141 * fVar30;
            fVar40 = auVar69._16_4_;
            fVar142 = auVar103._16_4_;
            auVar77._16_4_ = fVar142 * fVar40;
            fVar50 = auVar69._20_4_;
            fVar143 = auVar103._20_4_;
            auVar77._20_4_ = fVar143 * fVar50;
            fVar60 = auVar69._24_4_;
            uVar76 = auVar4._12_4_;
            fVar144 = auVar103._24_4_;
            auVar77._24_4_ = fVar144 * fVar60;
            auVar77._28_4_ = uVar76;
            local_1600 = vsubps_avx(auVar77,auVar75);
            fVar126 = auVar109._0_4_;
            fVar11 = auVar109._4_4_;
            auVar78._4_4_ = fVar139 * fVar11;
            auVar78._0_4_ = fVar136 * fVar126;
            fVar21 = auVar109._8_4_;
            auVar78._8_4_ = fVar140 * fVar21;
            fVar31 = auVar109._12_4_;
            auVar78._12_4_ = fVar141 * fVar31;
            fVar41 = auVar109._16_4_;
            auVar78._16_4_ = fVar142 * fVar41;
            fVar51 = auVar109._20_4_;
            auVar78._20_4_ = fVar143 * fVar51;
            fVar61 = auVar109._24_4_;
            auVar78._24_4_ = fVar144 * fVar61;
            auVar78._28_4_ = uVar76;
            fVar123 = local_1580._0_4_;
            fVar12 = local_1580._4_4_;
            auVar80._4_4_ = fVar9 * fVar12;
            auVar80._0_4_ = fVar122 * fVar123;
            fVar22 = local_1580._8_4_;
            auVar80._8_4_ = fVar19 * fVar22;
            fVar32 = local_1580._12_4_;
            auVar80._12_4_ = fVar29 * fVar32;
            fVar42 = local_1580._16_4_;
            auVar80._16_4_ = fVar39 * fVar42;
            fVar52 = local_1580._20_4_;
            auVar80._20_4_ = fVar49 * fVar52;
            fVar62 = local_1580._24_4_;
            fVar79 = auVar127._12_4_;
            auVar80._24_4_ = fVar59 * fVar62;
            auVar80._28_4_ = fVar79;
            auVar103 = vsubps_avx(auVar80,auVar78);
            auVar81._4_4_ = fVar10 * fVar12;
            auVar81._0_4_ = fVar124 * fVar123;
            auVar81._8_4_ = fVar20 * fVar22;
            auVar81._12_4_ = fVar30 * fVar32;
            auVar81._16_4_ = fVar40 * fVar42;
            auVar81._20_4_ = fVar50 * fVar52;
            auVar81._24_4_ = fVar60 * fVar62;
            auVar81._28_4_ = fVar79;
            auVar82._4_4_ = fVar159 * fVar11;
            auVar82._0_4_ = fVar157 * fVar126;
            auVar82._8_4_ = fVar160 * fVar21;
            auVar82._12_4_ = fVar161 * fVar31;
            auVar82._16_4_ = fVar162 * fVar41;
            auVar82._20_4_ = fVar163 * fVar51;
            auVar82._24_4_ = fVar164 * fVar61;
            auVar82._28_4_ = local_1540._28_4_;
            local_1560 = vsubps_avx(auVar82,auVar81);
            uVar92 = *(undefined4 *)&(ray->org).field_0;
            auVar158._4_4_ = uVar92;
            auVar158._0_4_ = uVar92;
            auVar158._8_4_ = uVar92;
            auVar158._12_4_ = uVar92;
            auVar158._16_4_ = uVar92;
            auVar158._20_4_ = uVar92;
            auVar158._24_4_ = uVar92;
            auVar158._28_4_ = uVar92;
            uVar92 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar165._4_4_ = uVar92;
            auVar165._0_4_ = uVar92;
            auVar165._8_4_ = uVar92;
            auVar165._12_4_ = uVar92;
            auVar165._16_4_ = uVar92;
            auVar165._20_4_ = uVar92;
            auVar165._24_4_ = uVar92;
            auVar165._28_4_ = uVar92;
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar166._4_4_ = uVar1;
            auVar166._0_4_ = uVar1;
            auVar166._8_4_ = uVar1;
            auVar166._12_4_ = uVar1;
            auVar166._16_4_ = uVar1;
            auVar166._20_4_ = uVar1;
            auVar166._24_4_ = uVar1;
            auVar166._28_4_ = uVar1;
            fVar116 = (ray->dir).field_0.m128[1];
            auVar71 = vsubps_avx(auVar114,auVar158);
            fVar120 = (ray->dir).field_0.m128[2];
            auVar72 = vsubps_avx(auVar129,auVar165);
            auVar73 = vsubps_avx(auVar134,auVar166);
            fVar125 = auVar73._0_4_;
            fVar13 = auVar73._4_4_;
            auVar83._4_4_ = fVar116 * fVar13;
            auVar83._0_4_ = fVar116 * fVar125;
            fVar23 = auVar73._8_4_;
            auVar83._8_4_ = fVar116 * fVar23;
            fVar33 = auVar73._12_4_;
            auVar83._12_4_ = fVar116 * fVar33;
            fVar43 = auVar73._16_4_;
            auVar83._16_4_ = fVar116 * fVar43;
            fVar53 = auVar73._20_4_;
            auVar83._20_4_ = fVar116 * fVar53;
            fVar63 = auVar73._24_4_;
            auVar83._24_4_ = fVar116 * fVar63;
            auVar83._28_4_ = uVar92;
            fVar119 = auVar72._0_4_;
            fVar14 = auVar72._4_4_;
            auVar84._4_4_ = fVar120 * fVar14;
            auVar84._0_4_ = fVar120 * fVar119;
            fVar24 = auVar72._8_4_;
            auVar84._8_4_ = fVar120 * fVar24;
            fVar34 = auVar72._12_4_;
            auVar84._12_4_ = fVar120 * fVar34;
            fVar44 = auVar72._16_4_;
            auVar84._16_4_ = fVar120 * fVar44;
            fVar54 = auVar72._20_4_;
            auVar84._20_4_ = fVar120 * fVar54;
            fVar64 = auVar72._24_4_;
            auVar84._24_4_ = fVar120 * fVar64;
            auVar84._28_4_ = uVar1;
            auVar72 = vsubps_avx(auVar84,auVar83);
            fVar121 = (ray->dir).field_0.m128[0];
            fVar5 = auVar71._0_4_;
            fVar15 = auVar71._4_4_;
            auVar85._4_4_ = fVar120 * fVar15;
            auVar85._0_4_ = fVar120 * fVar5;
            fVar25 = auVar71._8_4_;
            auVar85._8_4_ = fVar120 * fVar25;
            fVar35 = auVar71._12_4_;
            auVar85._12_4_ = fVar120 * fVar35;
            fVar45 = auVar71._16_4_;
            auVar85._16_4_ = fVar120 * fVar45;
            fVar55 = auVar71._20_4_;
            auVar85._20_4_ = fVar120 * fVar55;
            fVar65 = auVar71._24_4_;
            auVar85._24_4_ = fVar120 * fVar65;
            auVar85._28_4_ = local_1600._28_4_;
            auVar86._4_4_ = fVar121 * fVar13;
            auVar86._0_4_ = fVar121 * fVar125;
            auVar86._8_4_ = fVar121 * fVar23;
            auVar86._12_4_ = fVar121 * fVar33;
            auVar86._16_4_ = fVar121 * fVar43;
            auVar86._20_4_ = fVar121 * fVar53;
            auVar86._24_4_ = fVar121 * fVar63;
            auVar86._28_4_ = uVar76;
            auVar71 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = fVar121 * fVar14;
            auVar87._0_4_ = fVar121 * fVar119;
            auVar87._8_4_ = fVar121 * fVar24;
            auVar87._12_4_ = fVar121 * fVar34;
            auVar87._16_4_ = fVar121 * fVar44;
            auVar87._20_4_ = fVar121 * fVar54;
            auVar87._24_4_ = fVar121 * fVar64;
            auVar87._28_4_ = uVar76;
            auVar88._4_4_ = fVar116 * fVar15;
            auVar88._0_4_ = fVar116 * fVar5;
            auVar88._8_4_ = fVar116 * fVar25;
            auVar88._12_4_ = fVar116 * fVar35;
            auVar88._16_4_ = fVar116 * fVar45;
            auVar88._20_4_ = fVar116 * fVar55;
            auVar88._24_4_ = fVar116 * fVar65;
            auVar88._28_4_ = fVar79;
            auVar73 = vsubps_avx(auVar88,auVar87);
            fVar6 = local_1560._0_4_;
            fVar16 = local_1560._4_4_;
            fVar26 = local_1560._8_4_;
            fVar36 = local_1560._12_4_;
            fVar46 = local_1560._16_4_;
            fVar56 = local_1560._20_4_;
            fVar66 = local_1560._24_4_;
            fVar7 = auVar103._0_4_;
            fVar17 = auVar103._4_4_;
            fVar27 = auVar103._8_4_;
            fVar37 = auVar103._12_4_;
            fVar47 = auVar103._16_4_;
            fVar57 = auVar103._20_4_;
            fVar67 = auVar103._24_4_;
            fVar8 = local_1600._0_4_;
            fVar18 = local_1600._4_4_;
            fVar28 = local_1600._8_4_;
            fVar38 = local_1600._12_4_;
            fVar48 = local_1600._16_4_;
            fVar58 = local_1600._20_4_;
            fVar68 = local_1600._24_4_;
            auVar111._0_4_ = fVar121 * fVar8 + fVar116 * fVar7 + fVar120 * fVar6;
            auVar111._4_4_ = fVar121 * fVar18 + fVar116 * fVar17 + fVar120 * fVar16;
            auVar111._8_4_ = fVar121 * fVar28 + fVar116 * fVar27 + fVar120 * fVar26;
            auVar111._12_4_ = fVar121 * fVar38 + fVar116 * fVar37 + fVar120 * fVar36;
            auVar111._16_4_ = fVar121 * fVar48 + fVar116 * fVar47 + fVar120 * fVar46;
            auVar111._20_4_ = fVar121 * fVar58 + fVar116 * fVar57 + fVar120 * fVar56;
            auVar111._24_4_ = fVar121 * fVar68 + fVar116 * fVar67 + fVar120 * fVar66;
            auVar111._28_4_ = fVar120 + fVar120 + fVar79;
            auVar106._8_4_ = 0x80000000;
            auVar106._0_8_ = 0x8000000080000000;
            auVar106._12_4_ = 0x80000000;
            auVar106._16_4_ = 0x80000000;
            auVar106._20_4_ = 0x80000000;
            auVar106._24_4_ = 0x80000000;
            auVar106._28_4_ = 0x80000000;
            auVar103 = vandps_avx(auVar111,auVar106);
            uVar96 = auVar103._0_4_;
            auVar131._0_4_ =
                 (float)(uVar96 ^ (uint)(fVar126 * auVar72._0_4_ +
                                        fVar124 * auVar71._0_4_ + fVar122 * auVar73._0_4_));
            uVar147 = auVar103._4_4_;
            auVar131._4_4_ =
                 (float)(uVar147 ^
                        (uint)(fVar11 * auVar72._4_4_ +
                              fVar10 * auVar71._4_4_ + fVar9 * auVar73._4_4_));
            uVar148 = auVar103._8_4_;
            auVar131._8_4_ =
                 (float)(uVar148 ^
                        (uint)(fVar21 * auVar72._8_4_ +
                              fVar20 * auVar71._8_4_ + fVar19 * auVar73._8_4_));
            uVar149 = auVar103._12_4_;
            auVar131._12_4_ =
                 (float)(uVar149 ^
                        (uint)(fVar31 * auVar72._12_4_ +
                              fVar30 * auVar71._12_4_ + fVar29 * auVar73._12_4_));
            uVar150 = auVar103._16_4_;
            auVar131._16_4_ =
                 (float)(uVar150 ^
                        (uint)(fVar41 * auVar72._16_4_ +
                              fVar40 * auVar71._16_4_ + fVar39 * auVar73._16_4_));
            uVar151 = auVar103._20_4_;
            auVar131._20_4_ =
                 (float)(uVar151 ^
                        (uint)(fVar51 * auVar72._20_4_ +
                              fVar50 * auVar71._20_4_ + fVar49 * auVar73._20_4_));
            uVar152 = auVar103._24_4_;
            auVar131._24_4_ =
                 (float)(uVar152 ^
                        (uint)(fVar61 * auVar72._24_4_ +
                              fVar60 * auVar71._24_4_ + fVar59 * auVar73._24_4_));
            uVar153 = auVar103._28_4_;
            auVar131._28_4_ =
                 (float)(uVar153 ^ (uint)(auVar109._28_4_ + auVar69._28_4_ + auVar70._28_4_));
            auVar137._0_4_ =
                 (float)(uVar96 ^ (uint)(auVar72._0_4_ * fVar123 +
                                        auVar71._0_4_ * fVar157 + fVar136 * auVar73._0_4_));
            auVar137._4_4_ =
                 (float)(uVar147 ^
                        (uint)(auVar72._4_4_ * fVar12 +
                              auVar71._4_4_ * fVar159 + fVar139 * auVar73._4_4_));
            auVar137._8_4_ =
                 (float)(uVar148 ^
                        (uint)(auVar72._8_4_ * fVar22 +
                              auVar71._8_4_ * fVar160 + fVar140 * auVar73._8_4_));
            auVar137._12_4_ =
                 (float)(uVar149 ^
                        (uint)(auVar72._12_4_ * fVar32 +
                              auVar71._12_4_ * fVar161 + fVar141 * auVar73._12_4_));
            auVar137._16_4_ =
                 (float)(uVar150 ^
                        (uint)(auVar72._16_4_ * fVar42 +
                              auVar71._16_4_ * fVar162 + fVar142 * auVar73._16_4_));
            auVar137._20_4_ =
                 (float)(uVar151 ^
                        (uint)(auVar72._20_4_ * fVar52 +
                              auVar71._20_4_ * fVar163 + fVar143 * auVar73._20_4_));
            auVar137._24_4_ =
                 (float)(uVar152 ^
                        (uint)(auVar72._24_4_ * fVar62 +
                              auVar71._24_4_ * fVar164 + fVar144 * auVar73._24_4_));
            auVar137._28_4_ = (float)(uVar153 ^ (uint)(auVar71._28_4_ + auVar73._28_4_ + -0.0));
            auVar109 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar103 = vcmpps_avx(auVar131,auVar109,5);
            auVar109 = vcmpps_avx(auVar137,auVar109,5);
            auVar103 = vandps_avx(auVar103,auVar109);
            auVar107._8_4_ = 0x7fffffff;
            auVar107._0_8_ = 0x7fffffff7fffffff;
            auVar107._12_4_ = 0x7fffffff;
            auVar107._16_4_ = 0x7fffffff;
            auVar107._20_4_ = 0x7fffffff;
            auVar107._24_4_ = 0x7fffffff;
            auVar107._28_4_ = 0x7fffffff;
            local_1320 = vandps_avx(auVar111,auVar107);
            auVar109 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar111,4);
            auVar103 = vandps_avx(auVar103,auVar109);
            auVar108._0_4_ = auVar137._0_4_ + auVar131._0_4_;
            auVar108._4_4_ = auVar137._4_4_ + auVar131._4_4_;
            auVar108._8_4_ = auVar137._8_4_ + auVar131._8_4_;
            auVar108._12_4_ = auVar137._12_4_ + auVar131._12_4_;
            auVar108._16_4_ = auVar137._16_4_ + auVar131._16_4_;
            auVar108._20_4_ = auVar137._20_4_ + auVar131._20_4_;
            auVar108._24_4_ = auVar137._24_4_ + auVar131._24_4_;
            auVar108._28_4_ = auVar137._28_4_ + auVar131._28_4_;
            auVar69 = vcmpps_avx(auVar108,local_1320,2);
            auVar109 = vandps_avx(auVar103,auVar69);
            auVar70 = local_1520 & auVar109;
            if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar70 >> 0x7f,0) != '\0') ||
                  (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar70 >> 0xbf,0) != '\0') ||
                (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar70[0x1f] < '\0') {
              auVar109 = vandps_avx(auVar109,local_1520);
              local_1340._0_4_ =
                   (float)(uVar96 ^ (uint)(fVar8 * fVar5 + fVar7 * fVar119 + fVar125 * fVar6));
              local_1340._4_4_ =
                   (float)(uVar147 ^ (uint)(fVar18 * fVar15 + fVar17 * fVar14 + fVar13 * fVar16));
              local_1340._8_4_ =
                   (float)(uVar148 ^ (uint)(fVar28 * fVar25 + fVar27 * fVar24 + fVar23 * fVar26));
              local_1340._12_4_ =
                   (float)(uVar149 ^ (uint)(fVar38 * fVar35 + fVar37 * fVar34 + fVar33 * fVar36));
              local_1340._16_4_ =
                   (float)(uVar150 ^ (uint)(fVar48 * fVar45 + fVar47 * fVar44 + fVar43 * fVar46));
              local_1340._20_4_ =
                   (float)(uVar151 ^ (uint)(fVar58 * fVar55 + fVar57 * fVar54 + fVar53 * fVar56));
              local_1340._24_4_ =
                   (float)(uVar152 ^ (uint)(fVar68 * fVar65 + fVar67 * fVar64 + fVar63 * fVar66));
              local_1340._28_4_ =
                   uVar153 ^ (uint)(auVar69._28_4_ + auVar69._28_4_ + auVar103._28_4_);
              fVar116 = (ray->org).field_0.m128[3];
              fVar120 = local_1320._0_4_;
              fVar121 = local_1320._4_4_;
              auVar89._4_4_ = fVar121 * fVar116;
              auVar89._0_4_ = fVar120 * fVar116;
              fVar122 = local_1320._8_4_;
              auVar89._8_4_ = fVar122 * fVar116;
              fVar124 = local_1320._12_4_;
              auVar89._12_4_ = fVar124 * fVar116;
              fVar126 = local_1320._16_4_;
              auVar89._16_4_ = fVar126 * fVar116;
              fVar123 = local_1320._20_4_;
              auVar89._20_4_ = fVar123 * fVar116;
              fVar125 = local_1320._24_4_;
              auVar89._24_4_ = fVar125 * fVar116;
              auVar89._28_4_ = fVar116;
              auVar103 = vcmpps_avx(auVar89,local_1340,1);
              fVar116 = ray->tfar;
              auVar90._4_4_ = fVar121 * fVar116;
              auVar90._0_4_ = fVar120 * fVar116;
              auVar90._8_4_ = fVar122 * fVar116;
              auVar90._12_4_ = fVar124 * fVar116;
              auVar90._16_4_ = fVar126 * fVar116;
              auVar90._20_4_ = fVar123 * fVar116;
              auVar90._24_4_ = fVar125 * fVar116;
              auVar90._28_4_ = fVar116;
              auVar69 = vcmpps_avx(local_1340,auVar90,2);
              auVar103 = vandps_avx(auVar69,auVar103);
              auVar69 = auVar109 & auVar103;
              if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar69 >> 0x7f,0) != '\0') ||
                    (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar69 >> 0xbf,0) != '\0') ||
                  (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar69[0x1f] < '\0') {
                local_12e0 = vandps_avx(auVar109,auVar103);
                auVar103 = vsubps_avx(local_1320,auVar137);
                local_1380 = vblendvps_avx(auVar131,auVar103,local_14e0);
                auVar103 = vsubps_avx(local_1320,auVar131);
                local_1360 = vblendvps_avx(auVar137,auVar103,local_14e0);
                uStack_1244 = local_14e0._28_4_;
                local_1260[0] = fVar8 * (float)local_1500._0_4_;
                local_1260[1] = fVar18 * (float)local_1500._4_4_;
                local_1260[2] = fVar28 * fStack_14f8;
                local_1260[3] = fVar38 * fStack_14f4;
                fStack_1250 = fVar48 * fStack_14f0;
                fStack_124c = fVar58 * fStack_14ec;
                fStack_1248 = fVar68 * fStack_14e8;
                local_1240[0] = fVar7 * (float)local_1500._0_4_;
                local_1240[1] = fVar17 * (float)local_1500._4_4_;
                local_1240[2] = fVar27 * fStack_14f8;
                local_1240[3] = fVar37 * fStack_14f4;
                fStack_1230 = fVar47 * fStack_14f0;
                fStack_122c = fVar57 * fStack_14ec;
                fStack_1228 = fVar67 * fStack_14e8;
                uStack_1224 = uStack_1244;
                local_1220[0] = (float)local_1500._0_4_ * fVar6;
                local_1220[1] = (float)local_1500._4_4_ * fVar16;
                local_1220[2] = fStack_14f8 * fVar26;
                local_1220[3] = fStack_14f4 * fVar36;
                fStack_1210 = fStack_14f0 * fVar46;
                fStack_120c = fStack_14ec * fVar56;
                fStack_1208 = fStack_14e8 * fVar66;
                uStack_1204 = uStack_1244;
                auVar103 = vrcpps_avx(local_1320);
                fVar116 = auVar103._0_4_;
                fVar119 = auVar103._4_4_;
                auVar91._4_4_ = fVar121 * fVar119;
                auVar91._0_4_ = fVar120 * fVar116;
                fVar120 = auVar103._8_4_;
                auVar91._8_4_ = fVar122 * fVar120;
                fVar121 = auVar103._12_4_;
                auVar91._12_4_ = fVar124 * fVar121;
                fVar122 = auVar103._16_4_;
                auVar91._16_4_ = fVar126 * fVar122;
                fVar124 = auVar103._20_4_;
                auVar91._20_4_ = fVar123 * fVar124;
                fVar126 = auVar103._24_4_;
                auVar91._24_4_ = fVar125 * fVar126;
                auVar91._28_4_ = local_1320._28_4_;
                auVar132._8_4_ = 0x3f800000;
                auVar132._0_8_ = 0x3f8000003f800000;
                auVar132._12_4_ = 0x3f800000;
                auVar132._16_4_ = 0x3f800000;
                auVar132._20_4_ = 0x3f800000;
                auVar132._24_4_ = 0x3f800000;
                auVar132._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx(auVar132,auVar91);
                fVar116 = fVar116 + fVar116 * auVar103._0_4_;
                fVar119 = fVar119 + fVar119 * auVar103._4_4_;
                fVar120 = fVar120 + fVar120 * auVar103._8_4_;
                fVar121 = fVar121 + fVar121 * auVar103._12_4_;
                fVar122 = fVar122 + fVar122 * auVar103._16_4_;
                fVar124 = fVar124 + fVar124 * auVar103._20_4_;
                fVar126 = fVar126 + fVar126 * auVar103._24_4_;
                local_1280._4_4_ = fVar119 * local_1340._4_4_;
                local_1280._0_4_ = fVar116 * local_1340._0_4_;
                local_1280._8_4_ = fVar120 * local_1340._8_4_;
                local_1280._12_4_ = fVar121 * local_1340._12_4_;
                local_1280._16_4_ = fVar122 * local_1340._16_4_;
                local_1280._20_4_ = fVar124 * local_1340._20_4_;
                local_1280._24_4_ = fVar126 * local_1340._24_4_;
                local_1280._28_4_ = local_1340._28_4_;
                local_12c0[0] = local_1380._0_4_ * fVar116;
                local_12c0[1] = local_1380._4_4_ * fVar119;
                local_12c0[2] = local_1380._8_4_ * fVar120;
                local_12c0[3] = local_1380._12_4_ * fVar121;
                fStack_12b0 = local_1380._16_4_ * fVar122;
                fStack_12ac = local_1380._20_4_ * fVar124;
                fStack_12a8 = local_1380._24_4_ * fVar126;
                uStack_12a4 = local_1380._28_4_;
                local_12a0._4_4_ = local_1360._4_4_ * fVar119;
                local_12a0._0_4_ = local_1360._0_4_ * fVar116;
                local_12a0._8_4_ = local_1360._8_4_ * fVar120;
                local_12a0._12_4_ = local_1360._12_4_ * fVar121;
                local_12a0._16_4_ = local_1360._16_4_ * fVar122;
                local_12a0._20_4_ = local_1360._20_4_ * fVar124;
                local_12a0._24_4_ = local_1360._24_4_ * fVar126;
                local_12a0._28_4_ = local_1380._28_4_;
                uVar92 = vmovmskps_avx(local_12e0);
                uVar93 = CONCAT44((int)((ulong)lVar94 >> 0x20),uVar92);
                local_1560._0_8_ = local_1608->scene;
                pSVar98 = local_1608->scene;
                do {
                  local_1540._0_8_ = uVar93;
                  uVar97 = 0;
                  if (uVar93 != 0) {
                    for (; (uVar93 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
                    }
                  }
                  local_1580._0_8_ = uVar97;
                  local_15c8 = *(uint *)((long)&local_13a0 + uVar97 * 4);
                  uVar95 = CONCAT44(0,local_15c8);
                  local_1600._0_8_ = uVar95;
                  local_1638 = (pSVar98->geometries).items[uVar95].ptr;
                  if ((local_1638->mask & ray->mask) == 0) {
                    uVar93 = uVar93 ^ 1L << (uVar97 & 0x3f);
                  }
                  else {
                    if ((local_1608->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_1600._0_8_ = ray,
                       local_1638->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002e9e45;
                    local_1640 = local_1608->args;
                    local_15b0.context = local_1608->user;
                    local_15e0 = local_1260[uVar97];
                    local_15dc = local_1240[uVar97];
                    local_15d8 = local_1220[uVar97];
                    local_15d4 = local_12c0[uVar97];
                    local_15d0 = *(undefined4 *)(local_12a0 + uVar97 * 4);
                    local_15cc = *(undefined4 *)((long)&local_13c0 + uVar97 * 4);
                    local_15c4 = (local_15b0.context)->instID[0];
                    local_15c0 = (local_15b0.context)->instPrimID[0];
                    fVar116 = ray->tfar;
                    ray->tfar = *(float *)(local_1280 + uVar97 * 4);
                    local_1644 = -1;
                    local_15b0.valid = &local_1644;
                    local_15b0.geometryUserPtr = local_1638->userPtr;
                    local_1600._0_8_ = ray;
                    local_15b0.hit = (RTCHitN *)&local_15e0;
                    local_15b0.N = 1;
                    local_15b0.ray = (RTCRayN *)ray;
                    if ((local_1638->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*local_1638->occlusionFilterN)(&local_15b0), *local_15b0.valid != 0)) {
                      if ((local_1640->filter == (RTCFilterFunctionN)0x0) ||
                         (((local_1640->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_1638->field_8).field_0x2 & 0x40) == 0)))) {
LAB_002e9e45:
                        ((Ray *)local_1600._0_8_)->tfar = -INFINITY;
                        return;
                      }
                      (*local_1640->filter)(&local_15b0);
                      if (*local_15b0.valid != 0) goto LAB_002e9e45;
                    }
                    *(float *)(local_1600._0_8_ + 0x20) = fVar116;
                    uVar93 = local_1540._0_8_ ^ 1L << (local_1580._0_8_ & 0x3f);
                    ray = (Ray *)local_1600._0_8_;
                  }
                  pSVar98 = (Scene *)local_1560._0_8_;
                } while (uVar93 != 0);
              }
            }
            local_1630 = local_1630 + 1;
          } while (local_1630 != local_1628);
        }
        auVar133 = ZEXT3264(local_13e0);
        auVar135 = ZEXT3264(local_1400);
        auVar138 = ZEXT3264(local_1420);
        auVar146 = ZEXT3264(local_1440);
        auVar155 = ZEXT3264(local_1460);
        auVar115 = ZEXT3264(local_1480);
        auVar118 = ZEXT3264(local_14a0);
        auVar130 = ZEXT3264(local_14c0);
      } while (local_1610 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }